

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCanon.c
# Opt level: O3

int Map_CanonComputeSlow
              (uint (*uTruths) [2],int nVarsMax,int nVarsReal,uint *uTruth,uchar *puPhases,
              uint *uTruthRes)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar3 = 1 << ((byte)nVarsReal & 0x1f);
  *uTruthRes = 0xffffffff;
  if (nVarsMax < 6) {
    if (nVarsReal == 0x1f) {
      iVar4 = 0;
      uVar3 = 0xffffffff;
    }
    else {
      uVar7 = 1;
      if (1 < (int)uVar3) {
        uVar7 = uVar3;
      }
      uVar3 = 0;
      iVar4 = 0;
      do {
        uVar10 = *uTruth;
        if (0 < nVarsMax) {
          uVar5 = 1;
          uVar9 = 0;
          do {
            if ((uVar5 & uVar3) != 0) {
              uVar10 = (uTruths[uVar9][0] & uVar10) >> ((byte)uVar5 & 0x1f) |
                       (~uTruths[uVar9][0] & uVar10) << ((byte)uVar5 & 0x1f);
            }
            uVar9 = uVar9 + 1;
            uVar5 = uVar5 * 2;
          } while ((uint)nVarsMax != uVar9);
        }
        if (uVar10 < *uTruthRes) {
          *uTruthRes = uVar10;
          *puPhases = (uchar)uVar3;
          iVar4 = 1;
        }
        else if (iVar4 < 4 && *uTruthRes == uVar10) {
          lVar6 = (long)iVar4;
          iVar4 = iVar4 + 1;
          puPhases[lVar6] = (uchar)uVar3;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != uVar7);
      uVar3 = *uTruthRes;
    }
    uTruthRes[1] = uVar3;
  }
  else {
    uTruthRes[1] = 0xffffffff;
    if (nVarsReal == 0x1f) goto LAB_008c7435;
    uVar7 = 1;
    if (1 < (int)uVar3) {
      uVar7 = uVar3;
    }
    uVar3 = 0;
    iVar4 = 0;
    do {
      uVar10 = *uTruth;
      uVar5 = uTruth[1];
      if (uVar3 != 0) {
        uVar8 = 1;
        uVar9 = 0;
        do {
          uVar1 = uVar10;
          uVar2 = uVar5;
          if (((uVar8 & uVar3) != 0) && (uVar1 = uVar5, uVar2 = uVar10, (int)uVar8 < 0x20)) {
            uVar1 = uTruths[uVar9][0];
            uVar2 = uTruths[uVar9][1];
            uVar1 = (uVar1 & uVar10) >> (ulong)uVar8 | (~uVar1 & uVar10) << uVar8;
            uVar2 = (uVar2 & uVar5) >> (ulong)uVar8 | ~uVar2 & uVar5;
          }
          uVar5 = uVar2;
          uVar10 = uVar1;
          uVar9 = uVar9 + 1;
          uVar8 = uVar8 * 2;
        } while ((uint)nVarsMax != uVar9);
      }
      if (uVar5 < uTruthRes[1]) {
LAB_008c735b:
        *uTruthRes = uVar10;
        uTruthRes[1] = uVar5;
        *puPhases = (uchar)uVar3;
        iVar4 = 1;
      }
      else if (uTruthRes[1] == uVar5) {
        if (uVar10 < *uTruthRes) goto LAB_008c735b;
        if (iVar4 < 4 && *uTruthRes == uVar10) {
          lVar6 = (long)iVar4;
          iVar4 = iVar4 + 1;
          puPhases[lVar6] = (uchar)uVar3;
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar7);
  }
  if (0 < iVar4) {
    return iVar4;
  }
LAB_008c7435:
  __assert_fail("nPhases > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mapper/mapperCanon.c"
                ,0x60,
                "int Map_CanonComputeSlow(unsigned int (*)[2], int, int, unsigned int *, unsigned char *, unsigned int *)"
               );
}

Assistant:

int Map_CanonComputeSlow( unsigned uTruths[][2], int nVarsMax, int nVarsReal, unsigned uTruth[], unsigned char * puPhases, unsigned uTruthRes[] )
{
    unsigned  uTruthPerm[2];
    int nMints, nPhases, m;

    nPhases = 0;
    nMints = (1 << nVarsReal);
    if ( nVarsMax < 6 )
    {
        uTruthRes[0] = MAP_MASK(32);
        for ( m = 0; m < nMints; m++ )
        {
            uTruthPerm[0] = Map_CanonComputePhase( uTruths, nVarsMax, uTruth[0], m );
            if ( uTruthRes[0] > uTruthPerm[0] )
            {
                uTruthRes[0] = uTruthPerm[0];
                nPhases      = 0;
                puPhases[nPhases++] = (unsigned char)m;
            }
            else if ( uTruthRes[0] == uTruthPerm[0] )
            {
                if ( nPhases < 4 ) // the max number of phases in Map_Super_t
                    puPhases[nPhases++] = (unsigned char)m;
            }
        }
        uTruthRes[1] = uTruthRes[0];
    }
    else
    {
        uTruthRes[0] = MAP_MASK(32);
        uTruthRes[1] = MAP_MASK(32);
        for ( m = 0; m < nMints; m++ )
        {
            Map_CanonComputePhase6( uTruths, nVarsMax, uTruth, m, uTruthPerm );
            if ( uTruthRes[1] > uTruthPerm[1] || (uTruthRes[1] == uTruthPerm[1] && uTruthRes[0] > uTruthPerm[0]) )
            {
                uTruthRes[0] = uTruthPerm[0];
                uTruthRes[1] = uTruthPerm[1];
                nPhases      = 0;
                puPhases[nPhases++] = (unsigned char)m;
            }
            else if ( uTruthRes[1] == uTruthPerm[1] && uTruthRes[0] == uTruthPerm[0] )
            {
                if ( nPhases < 4 ) // the max number of phases in Map_Super_t
                    puPhases[nPhases++] = (unsigned char)m;
            }
        }
    }
    assert( nPhases > 0 );
//    printf( "%d ", nPhases );
    return nPhases;
}